

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ini.h
# Opt level: O2

ini_t * ini_load(char *data,void *memctx)

{
  char *pcVar1;
  int section;
  ini_t *ini;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  char cVar5;
  int value_length;
  char *pcVar6;
  
  ini = ini_create(memctx);
  if (data != (char *)0x0) {
    section = 0;
LAB_001083e2:
    cVar5 = *data;
    if (cVar5 != '\0') {
      pcVar6 = data + 2;
      pcVar1 = data;
      while ((pcVar3 = pcVar1 + 1, cVar5 != '\0' && (cVar5 < '!'))) {
        pcVar6 = pcVar6 + 1;
        pcVar1 = pcVar3;
        cVar5 = *pcVar3;
      }
      data = pcVar1;
      if (cVar5 == ';') {
        cVar5 = ';';
        while ((cVar5 != '\0' && (cVar5 != '\n'))) {
          pcVar1 = data + 1;
          data = data + 1;
          cVar5 = *pcVar1;
        }
      }
      else if (cVar5 == '[') {
        iVar2 = 0;
        data = pcVar3;
        while( true ) {
          cVar5 = *data;
          if ((cVar5 == '\0') || (cVar5 == '\n')) goto LAB_001083e2;
          if (cVar5 == ']') break;
          data = data + 1;
          iVar2 = iVar2 + 1;
        }
        section = ini_section_add(ini,pcVar3,iVar2);
        data = data + 1;
      }
      else {
        if (cVar5 == '\0') {
          return ini;
        }
        iVar2 = 0;
        while ((cVar5 != '\0' && (cVar5 != '\n'))) {
          if (cVar5 == '=') goto LAB_00108464;
          pcVar4 = data + 1;
          data = data + 1;
          iVar2 = iVar2 + 1;
          pcVar3 = pcVar3 + 1;
          pcVar6 = pcVar6 + 1;
          cVar5 = *pcVar4;
        }
      }
      goto LAB_001083e2;
    }
  }
  return ini;
  while( true ) {
    pcVar6 = data + 1;
    pcVar3 = pcVar4 + 1;
    if (cVar5 == '\0') break;
LAB_00108464:
    pcVar4 = pcVar3;
    data = pcVar6;
    cVar5 = *pcVar4;
    if ((' ' < cVar5) || (cVar5 == '\n')) break;
  }
  value_length = 1;
  pcVar6 = pcVar4;
  while ((cVar5 != '\n' && (cVar5 != '\0'))) {
    pcVar3 = pcVar6 + 1;
    pcVar6 = pcVar6 + 1;
    data = data + 1;
    value_length = value_length + 1;
    cVar5 = *pcVar3;
  }
  do {
    value_length = value_length + -1;
    pcVar6 = data + -2;
    data = data + -1;
  } while (*pcVar6 < '!');
  ini_property_add(ini,section,pcVar1,iVar2,pcVar4,value_length);
  goto LAB_001083e2;
}

Assistant:

ini_t* ini_load( char const* data, void* memctx )
    {
    ini_t* ini;
    char const* ptr;
    int s;
    char const* start;
    char const* start2;
    int l;

    ini = ini_create( memctx );

    ptr = data;
    if( ptr )
        {
        s = 0;
        while( *ptr )
            {
            /* trim leading whitespace */
            while( *ptr && *ptr <=' ' )
                ++ptr;
            
            /* done? */
            if( !*ptr ) break;

            /* comment */
            else if( *ptr == ';' )
                {
                while( *ptr && *ptr !='\n' )
                    ++ptr;
                }
            /* section */
            else if( *ptr == '[' )
                {
                ++ptr;
                start = ptr;
                while( *ptr && *ptr !=']' && *ptr != '\n' )
                    ++ptr;

                if( *ptr == ']' )
                    {
                    s = ini_section_add( ini, start, (int)( ptr - start) );
                    ++ptr;
                    }
                }
            /* property */
            else
                {
                start = ptr;
                while( *ptr && *ptr !='=' && *ptr != '\n' )
                    ++ptr;

                if( *ptr == '=' )
                    {
                    l = (int)( ptr - start);
                    ++ptr;
                    while( *ptr && *ptr <= ' ' && *ptr != '\n' ) 
                        ptr++;
                    start2 = ptr;
                    while( *ptr && *ptr != '\n' )
                        ++ptr;
                    while( *(--ptr) <= ' ' ) 
                        (void)ptr;
                    ptr++;
                    ini_property_add( ini, s, start, l, start2, (int)( ptr - start2) );
                    }
                }
            }
        }   

    return ini;
    }